

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ImageFeatureType_ImageSize::SerializeWithCachedSizes
          (ImageFeatureType_ImageSize *this,CodedOutputStream *output)

{
  if (this->width_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,this->width_,output);
  }
  if (this->height_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,this->height_,output);
    return;
  }
  return;
}

Assistant:

void ImageFeatureType_ImageSize::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ImageFeatureType.ImageSize)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 width = 1;
  if (this->width() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->width(), output);
  }

  // uint64 height = 2;
  if (this->height() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->height(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ImageFeatureType.ImageSize)
}